

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keygen-noise.c
# Opt level: O0

char * get_random_data(int len,char *device)

{
  FILE *pFVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  ssize_t sVar5;
  ulong local_40;
  size_t i;
  int local_30;
  int ret;
  int ngot;
  int fd;
  char *buf;
  char *device_local;
  char *pcStack_10;
  int len_local;
  
  pcStack_10 = (char *)safemalloc((long)len,1,0);
  buf = device;
  if (device == (char *)0x0) {
    for (local_40 = 0; local_40 < 2; local_40 = local_40 + 1) {
      iVar2 = access(get_random_data::default_devices[local_40],4);
      if (iVar2 == 0) {
        buf = get_random_data::default_devices[local_40];
        break;
      }
    }
    if (buf == (char *)0x0) {
      safefree(pcStack_10);
      fprintf(_stderr,"puttygen: cannot find a readable random number source; use --random-device\n"
             );
      return (char *)0x0;
    }
  }
  iVar2 = open(buf,0);
  if (iVar2 < 0) {
    safefree(pcStack_10);
    pFVar1 = _stderr;
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(pFVar1,"puttygen: %s: open: %s\n",buf,pcVar4);
    pcStack_10 = (char *)0x0;
  }
  else {
    for (local_30 = 0; local_30 < len; local_30 = (int)sVar5 + local_30) {
      sVar5 = read(iVar2,pcStack_10 + local_30,(long)(len - local_30));
      if ((int)sVar5 < 0) {
        close(iVar2);
        safefree(pcStack_10);
        pFVar1 = _stderr;
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(pFVar1,"puttygen: %s: read: %s\n",buf,pcVar4);
        return (char *)0x0;
      }
    }
    close(iVar2);
  }
  return pcStack_10;
}

Assistant:

char *get_random_data(int len, const char *device)
{
    char *buf = snewn(len, char);
    int fd;
    int ngot, ret;

    if (!device) {
        static const char *const default_devices[] = {
            "/dev/urandom", "/dev/random"
        };
        size_t i;

        for (i = 0; i < lenof(default_devices); i++) {
            if (access(default_devices[i], R_OK) == 0) {
                device = default_devices[i];
                break;
            }
        }

        if (!device) {
            sfree(buf);
            fprintf(stderr, "puttygen: cannot find a readable "
                    "random number source; use --random-device\n");
            return NULL;
        }
    }

    fd = open(device, O_RDONLY);
    if (fd < 0) {
        sfree(buf);
        fprintf(stderr, "puttygen: %s: open: %s\n",
                device, strerror(errno));
        return NULL;
    }

    ngot = 0;
    while (ngot < len) {
        ret = read(fd, buf+ngot, len-ngot);
        if (ret < 0) {
            close(fd);
            sfree(buf);
            fprintf(stderr, "puttygen: %s: read: %s\n",
                    device, strerror(errno));
            return NULL;
        }
        ngot += ret;
    }

    close(fd);

    return buf;
}